

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plaRead.c
# Opt level: O0

Vec_Str_t * Pla_ReadPlaBody(char *pBuffer,char *pLimit,Pla_File_t Type)

{
  Vec_Str_t *p;
  bool bVar1;
  Vec_Str_t *vLits;
  char *pTemp;
  Pla_File_t Type_local;
  char *pLimit_local;
  char *pBuffer_local;
  
  p = Vec_StrAlloc(10000);
  vLits = (Vec_Str_t *)pBuffer;
  do {
    if (pLimit <= vLits) {
      return p;
    }
    if ((char)vLits->nCap == '.') {
      while( true ) {
        bVar1 = false;
        if ((char)vLits->nCap != '\0') {
          bVar1 = (char)vLits->nCap != '\n';
        }
        if (!bVar1) break;
        vLits = (Vec_Str_t *)((long)&vLits->nCap + 1);
      }
    }
    if ((char)vLits->nCap == '0') {
      Vec_StrPush(p,'\x01');
    }
    else if ((char)vLits->nCap == '1') {
      Vec_StrPush(p,'\x02');
    }
    else if (((char)vLits->nCap == '-') || ((char)vLits->nCap == '2')) {
      Vec_StrPush(p,'\0');
    }
    else if ((char)vLits->nCap == '~') {
      if ((Type == PLA_FILE_F) || (Type == PLA_FILE_FD)) {
        Vec_StrPush(p,'\x01');
      }
      else if (Type == PLA_FILE_FR) {
        Vec_StrPush(p,'\0');
      }
      else {
        if (Type != PLA_FILE_FDR) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/pla/plaRead.c"
                        ,0x98,"Vec_Str_t *Pla_ReadPlaBody(char *, char *, Pla_File_t)");
        }
        Vec_StrPush(p,'\x03');
      }
    }
    vLits = (Vec_Str_t *)((long)&vLits->nCap + 1);
  } while( true );
}

Assistant:

Vec_Str_t * Pla_ReadPlaBody( char * pBuffer, char * pLimit, Pla_File_t Type )
{
    char * pTemp;
    Vec_Str_t * vLits;
    vLits = Vec_StrAlloc( 10000 );
    for ( pTemp = pBuffer; pTemp < pLimit; pTemp++ )
    {
        if ( *pTemp == '.' )
            while ( *pTemp && *pTemp != '\n' )
                pTemp++;
        if ( *pTemp == '0' )
            Vec_StrPush( vLits, (char)PLA_LIT_ZERO );
        else if ( *pTemp == '1' )
            Vec_StrPush( vLits, (char)PLA_LIT_ONE );
        else if ( *pTemp == '-' || *pTemp == '2' )
            Vec_StrPush( vLits, (char)PLA_LIT_DASH );
        else if ( *pTemp == '~' ) // no meaning
        {
            if ( Type == PLA_FILE_F || Type == PLA_FILE_FD )
                Vec_StrPush( vLits, (char)PLA_LIT_ZERO );
            else if ( Type == PLA_FILE_FR )
                Vec_StrPush( vLits, (char)PLA_LIT_DASH );
            else if ( Type == PLA_FILE_FDR )
                Vec_StrPush( vLits, (char)PLA_LIT_FULL );
            else assert( 0 );
        }
    }
    return vLits;
}